

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

String * __thiscall kj::TaskSet::trace(String *__return_storage_ptr__,TaskSet *this)

{
  Task *pTVar1;
  String *pSVar2;
  RemoveConst<kj::String> *pRVar3;
  String *pSVar4;
  String *pSVar5;
  int iVar6;
  undefined4 extraout_var;
  ArrayDisposer *in_RCX;
  size_t newSize;
  Maybe<kj::Own<kj::TaskSet::Task>_> *pMVar7;
  Vector<kj::String> traces;
  Vector<kj::String> local_78;
  String *local_50;
  String local_48;
  
  local_78.builder.ptr = (String *)0x0;
  local_78.builder.pos = (String *)0x0;
  local_78.builder.endPtr = (String *)0x0;
  local_50 = __return_storage_ptr__;
  if ((this->tasks).ptr.ptr != (Task *)0x0) {
    pMVar7 = &this->tasks;
    do {
      pTVar1 = (pMVar7->ptr).ptr;
      iVar6 = (**(pTVar1->super_Event)._vptr_Event)(pTVar1);
      _::traceImpl(&local_48,&pTVar1->super_Event,(PromiseNode *)CONCAT44(extraout_var,iVar6));
      if (local_78.builder.pos == local_78.builder.endPtr) {
        newSize = ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 3) *
                  0x5555555555555556;
        if (local_78.builder.pos == local_78.builder.ptr) {
          newSize = 4;
        }
        Vector<kj::String>::setCapacity(&local_78,newSize);
      }
      ((local_78.builder.pos)->content).ptr = local_48.content.ptr;
      ((local_78.builder.pos)->content).size_ = local_48.content.size_;
      ((local_78.builder.pos)->content).disposer = local_48.content.disposer;
      local_78.builder.pos = local_78.builder.pos + 1;
      pTVar1 = (pMVar7->ptr).ptr;
      pMVar7 = &pTVar1->next;
      in_RCX = local_48.content.disposer;
    } while ((pTVar1->next).ptr.ptr != (Task *)0x0);
  }
  pSVar5 = local_50;
  strArray<kj::Vector<kj::String>&>
            (local_50,(kj *)&local_78,
             (Vector<kj::String> *)"\n============================================\n",(char *)in_RCX
            );
  pSVar4 = local_78.builder.endPtr;
  pRVar3 = local_78.builder.pos;
  pSVar2 = local_78.builder.ptr;
  if (local_78.builder.ptr != (String *)0x0) {
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    local_78.builder.endPtr = (String *)0x0;
    (*(code *)**(undefined8 **)local_78.builder.disposer)
              (local_78.builder.disposer,pSVar2,0x18,
               ((long)pRVar3 - (long)pSVar2 >> 3) * -0x5555555555555555,
               ((long)pSVar4 - (long)pSVar2 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return pSVar5;
}

Assistant:

kj::String TaskSet::trace() {
  kj::Vector<kj::String> traces;

  Maybe<Own<Task>>* ptr = &tasks;
  for (;;) {
    KJ_IF_MAYBE(task, *ptr) {
      traces.add(task->get()->trace());
      ptr = &task->get()->next;
    } else {
      break;
    }
  }